

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_3> *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  float afStack_a8 [6];
  float local_90 [4];
  float local_80 [2];
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  float fStack_5c;
  Vector<float,_3> res_2;
  float fStack_44;
  Matrix<float,_3,_4> res;
  long lVar8;
  
  pVVar1 = res.m_data.m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar7 = _DAT_019fcc00;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)((long)pVVar1 + lVar6 + -0x10) = uVar10;
        }
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)((long)pVVar1 + lVar6) = uVar10;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_3> *)((long)pVVar1 + 4);
    } while (lVar5 != 4);
    res.m_data.m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    res.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    res.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    res.m_data.m_data._32_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    res.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    pfVar2 = res.m_data.m_data[0].m_data + 2;
    res.m_data.m_data[3].m_data[1] = 0.0;
    res.m_data.m_data[3].m_data[2] = 0.0;
    res.m_data.m_data[2].m_data[0] = 0.0;
    res.m_data.m_data[2].m_data[1] = 0.0;
    res.m_data.m_data[2].m_data[2] = 0.0;
    res.m_data.m_data[3].m_data[0] = 0.0;
    res.m_data.m_data[0].m_data[2] = 0.0;
    res.m_data.m_data[1].m_data[0] = 0.0;
    res.m_data.m_data[1].m_data[1] = 0.0;
    res.m_data.m_data[1].m_data[2] = 0.0;
    puVar4 = &s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  pfVar2 = res_1.m_data;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  stack0xffffffffffffffb0 = 0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  stack0xffffffffffffffa0 = 0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar10;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  pVVar1 = &res_1;
  pfVar2 = res.m_data.m_data[0].m_data + 2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pVVar1->m_data + lVar5) = pfVar2[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar3 = lVar3 + 1;
    pVVar1 = pVVar1 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 4);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar3 = 0;
  do {
    local_90[lVar3] = res_1.m_data[lVar3] + res_2.m_data[lVar3 + -1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_3.m_data._0_8_ = res_3.m_data._0_8_ & 0xffffffff00000000;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar3 = 0;
  do {
    res_3.m_data[lVar3 + -2] = local_90[lVar3] + res_2.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_a8[4] = 0.0;
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_a8[lVar3 + 2] = res_3.m_data[lVar3 + -2] + res.m_data.m_data[0].m_data[lVar3 + -1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 1.4013e-45;
  res_3.m_data[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_3.m_data[lVar3 + -2]] = afStack_a8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}